

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O1

void ft_recompute_scaled_metrics(FT_Face face,FT_Size_Metrics *metrics)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)(int)metrics->y_scale;
  lVar2 = face->ascender * lVar1;
  metrics->ascender = (lVar2 + 0x8000 + (lVar2 >> 0x3f) >> 0x10) + 0x3fU & 0xffffffffffffffc0;
  lVar2 = face->descender * lVar1;
  metrics->descender = lVar2 + 0x8000 + (lVar2 >> 0x3f) >> 0x10 & 0xffffffffffffffc0;
  lVar1 = face->height * lVar1;
  metrics->height = (lVar1 + 0x8000 + (lVar1 >> 0x3f) >> 0x10) + 0x20U & 0xffffffffffffffc0;
  lVar1 = (long)(int)metrics->x_scale * (long)face->max_advance_width;
  metrics->max_advance = (lVar1 + 0x8000 + (lVar1 >> 0x3f) >> 0x10) + 0x20U & 0xffffffffffffffc0;
  return;
}

Assistant:

static void
  ft_recompute_scaled_metrics( FT_Face           face,
                               FT_Size_Metrics*  metrics )
  {
    /* Compute root ascender, descender, test height, and max_advance */

#ifdef GRID_FIT_METRICS
    metrics->ascender    = FT_PIX_CEIL( FT_MulFix( face->ascender,
                                                   metrics->y_scale ) );

    metrics->descender   = FT_PIX_FLOOR( FT_MulFix( face->descender,
                                                    metrics->y_scale ) );

    metrics->height      = FT_PIX_ROUND( FT_MulFix( face->height,
                                                    metrics->y_scale ) );

    metrics->max_advance = FT_PIX_ROUND( FT_MulFix( face->max_advance_width,
                                                    metrics->x_scale ) );
#else /* !GRID_FIT_METRICS */
    metrics->ascender    = FT_MulFix( face->ascender,
                                      metrics->y_scale );

    metrics->descender   = FT_MulFix( face->descender,
                                      metrics->y_scale );

    metrics->height      = FT_MulFix( face->height,
                                      metrics->y_scale );

    metrics->max_advance = FT_MulFix( face->max_advance_width,
                                      metrics->x_scale );
#endif /* !GRID_FIT_METRICS */
  }